

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::MultAdd
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  float fVar1;
  int64_t rows;
  double object;
  size_t sVar2;
  TPZDohrAssembleList<float> *this_00;
  TPZFMatrix<float> *this_01;
  float *pfVar3;
  int isub;
  long lVar4;
  long row;
  int64_t rows_00;
  _List_node_base *p_Var5;
  long lVar6;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  TPZDohrAssembleList<float> *local_260;
  TPZAutoPointer<TPZDohrAssembly<float>_> local_258;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZAutoPointer<TPZFMatrix<float>_> local_238;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_> data;
  TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_> v2work;
  TPZFMatrix<float> v2;
  TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_> v1threaddata;
  TPZSimpleTimer precondi;
  TPZFMatrix<float> v1;
  
  if (opt == 0) {
    lVar4 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    if (lVar4 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_0126912f;
  }
  else {
    lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_0126912f:
    if ((this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow == lVar4) goto LAB_01269148;
  }
  TPZMatrix<float>::Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_01269148:
  lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((((lVar4 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
       (lVar4 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol)) ||
      (lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow,
      lVar4 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) ||
     (lVar4 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<float>::Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZSimpleTimer::TPZSimpleTimer(&precondi);
  rows_00 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  rows = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  TPZMatrix<float>::PrepareZ(&this->super_TPZMatrix<float>,y,z,beta,opt);
  v2.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0;
  TPZFMatrix<float>::TPZFMatrix
            (&v1,rows_00,(x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol,(float *)&v2);
  v2work.fAccessLock.super___mutex_base._M_mutex.__align =
       (ulong)v2work.fAccessLock.super___mutex_base._M_mutex.__data.__count << 0x20;
  TPZFMatrix<float>::TPZFMatrix
            (&v2,rows,(x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol,(float *)&v2work);
  if (this->fNumThreads < 1) {
    ComputeV1(this,x,&v1);
    ComputeV2(this,x,&v2);
  }
  else {
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&AllThreads,(ulong)(uint)this->fNumThreads + 2,(allocator_type *)&v2work);
    data.fSubStructure.fRef = (TPZReference *)&v1threaddata;
    v1threaddata.fDohrMatrix = this;
    v1threaddata.fInput = x;
    v1threaddata.fOutput = &v1;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<float,TPZDohrSubstructCondense<float>>*,void>
              ((thread *)&v2work,
               TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_>::ComputeV1,
               (TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_> **)&data);
    std::thread::operator=
              (AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start,(thread *)&v2work);
    std::thread::~thread((thread *)&v2work);
    this_00 = (TPZDohrAssembleList<float> *)operator_new(0xe0);
    sVar2 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
            ._M_impl._M_node._M_size;
    local_258.fRef = (this->fAssemble).fRef;
    LOCK();
    ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<float>::TPZDohrAssembleList(this_00,(int)sVar2,&v2,&local_258);
    isub = 0;
    TPZAutoPointer<TPZDohrAssembleList<float>_>::TPZAutoPointer(&assemblelist,this_00);
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer(&local_258);
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&v2work.fWork;
    v2work.fAccessLock.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    v2work.fAccessLock.super___mutex_base._M_mutex._16_8_ = 0;
    v2work.fAccessLock.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    v2work.fAccessLock.super___mutex_base._M_mutex.__align = 0;
    v2work.fAccessLock.super___mutex_base._M_mutex._8_8_ = 0;
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
    ._M_impl._M_node._M_size = 0;
    v2work.fAssemblyStructure = assemblelist;
    LOCK();
    ((assemblelist.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((assemblelist.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p_Var5 = (_List_node_base *)&this->fGlobal;
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         v2work.fWork.
         super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var5 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)&this->fGlobal) {
      this_01 = (TPZFMatrix<float> *)operator_new(0x90);
      TPZFMatrix<float>::TPZFMatrix(this_01);
      TPZDohrAssembly<float>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,this_01);
      TPZAutoPointer<TPZFMatrix<float>_>::TPZAutoPointer(&local_238,this_01);
      TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>::TPZDohrPrecondV2SubData
                (&data,isub,(TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)(p_Var5 + 1),
                 &local_238);
      TPZAutoPointer<TPZFMatrix<float>_>::~TPZAutoPointer(&local_238);
      TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_>::AddItem(&v2work,&data);
      TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>::~TPZDohrPrecondV2SubData
                (&data);
      isub = isub + 1;
    }
    lVar4 = 0x10;
    for (lVar6 = 0; lVar6 < this->fNumThreads; lVar6 = lVar6 + 1) {
      local_260 = (TPZDohrAssembleList<float> *)&v2work;
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<float,TPZDohrSubstructCondense<float>>*,void>
                ((thread *)&data,
                 TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_>::ThreadWork,
                 (TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_> **)&local_260
                );
      std::thread::operator=
                ((thread *)
                 ((long)&((AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar4),
                 (thread *)&data);
      std::thread::~thread((thread *)&data);
      lVar4 = lVar4 + 8;
    }
    local_260 = (assemblelist.fRef)->fPointer;
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
              ((thread *)&data,TPZDohrAssembleList<float>::Assemble,&local_260);
    std::thread::operator=
              (AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + 1,(thread *)&data);
    std::thread::~thread((thread *)&data);
    for (lVar4 = 0; lVar4 < (long)this->fNumThreads + 2; lVar4 = lVar4 + 1) {
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_>::
    ~TPZDohrPrecondV2SubDataList(&v2work);
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer(&assemblelist);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&AllThreads);
  }
  TPZFMatrix<float>::operator+=(&v2,&v1.super_TPZMatrix<float>);
  lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  lVar6 = 0;
  if (rows_00 < 1) {
    rows_00 = lVar6;
  }
  if (lVar4 < 1) {
    lVar4 = lVar6;
  }
  for (; lVar6 != lVar4; lVar6 = lVar6 + 1) {
    for (row = 0; rows_00 != row; row = row + 1) {
      pfVar3 = TPZFMatrix<float>::operator()(&v2,row,lVar6);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()(z,row,lVar6);
      *pfVar3 = fVar1 + *pfVar3;
    }
  }
  object = TPZSimpleTimer::ReturnTimeDouble(&precondi);
  TPZStack<double,_10>::Push(&tempo.fPreCond,object);
  TPZFMatrix<float>::~TPZFMatrix(&v2);
  TPZFMatrix<float>::~TPZFMatrix(&v1);
  TPZSimpleTimer::~TPZSimpleTimer(&precondi);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}